

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_roundingutils.h
# Opt level: O0

bool icu_63::number::impl::roundingutils::roundsAtMidpoint(int roundingMode)

{
  int roundingMode_local;
  
  return 3 < (uint)roundingMode;
}

Assistant:

inline bool roundsAtMidpoint(int roundingMode) {
    switch (roundingMode) {
        case RoundingMode::UNUM_ROUND_UP:
        case RoundingMode::UNUM_ROUND_DOWN:
        case RoundingMode::UNUM_ROUND_CEILING:
        case RoundingMode::UNUM_ROUND_FLOOR:
            return false;

        default:
            return true;
    }
}